

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void bhdct_setup(planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
                ion_behaviour_fill_level_e fill_level)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  bhdct_master_table_init(tc);
  (*bhdct_context.init_fcn)(handler);
  bhdct_dictionary_initialization
            (tc,handler,dict,key_type_numeric_signed,4,4,bhdct_context.dictionary_size);
  switch(fill_level) {
  case ion_fill_edge_cases:
    iVar3 = -300;
    for (iVar1 = -100; iVar1 < -0x32; iVar1 = iVar1 + 2) {
      local_38 = iVar3;
      local_34 = iVar1;
      bhdct_insert(tc,dict,&local_34,&local_38,'\x01');
      iVar3 = iVar3 + 6;
    }
  case ion_fill_high:
    iVar1 = 5000;
    for (uVar2 = 500; uVar2 < 1000; uVar2 = uVar2 + 5) {
      local_40 = iVar1;
      local_3c = uVar2;
      bhdct_insert(tc,dict,&local_3c,&local_40,'\x01');
      iVar1 = iVar1 + 0x32;
    }
  case ion_fill_medium:
    iVar1 = 0xfa;
    for (uVar2 = 0x32; uVar2 < 100; uVar2 = uVar2 + 2) {
      local_48 = iVar1;
      local_44 = uVar2;
      bhdct_insert(tc,dict,&local_44,&local_48,'\x01');
      iVar1 = iVar1 + 10;
    }
  case ion_fill_low:
    iVar1 = 0;
    for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
      local_50 = iVar1;
      local_4c = iVar3;
      bhdct_insert(tc,dict,&local_4c,&local_50,'\x01');
      iVar1 = iVar1 + 2;
    }
    return;
  default:
    return;
  }
}

Assistant:

void
bhdct_setup(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_behaviour_fill_level_e	fill_level
) {
	bhdct_master_table_init(tc);
	bhdct_context.init_fcn(handler);
	/* Note most of these are fixed except the dictionary size */
	bhdct_dictionary_initialization(tc, handler, dict, key_type_numeric_signed, sizeof(int), sizeof(int), bhdct_context.dictionary_size);

	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_EDGE_VALUE(i), boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_HIGH_VALUE(i), boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_MEDIUM_VALUE(i), boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				bhdct_insert(tc, dict, IONIZE(i, int), ION_LOW_VALUE(i), boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}